

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O1

FSerializer * Serialize(FSerializer *arc,char *key,FSectorPortal *port,FSectorPortal *def)

{
  bool bVar1;
  FSerializer *pFVar2;
  
  bVar1 = FSerializer::BeginObject(arc,key);
  if (bVar1) {
    pFVar2 = Serialize(arc,"type",&port->mType,(int32_t *)0x0);
    pFVar2 = Serialize(pFVar2,"flags",&port->mFlags,(int32_t *)0x0);
    pFVar2 = Serialize(pFVar2,"partner",&port->mPartner,(uint32_t *)0x0);
    pFVar2 = Serialize(pFVar2,"plane",&port->mPlane,(int32_t *)0x0);
    pFVar2 = Serialize<sector_t>(pFVar2,"origin",(sector_t_conflict **)&port->mOrigin,
                                 (sector_t_conflict **)0x0);
    pFVar2 = Serialize<sector_t>(pFVar2,"destination",(sector_t_conflict **)&port->mDestination,
                                 (sector_t_conflict **)0x0);
    pFVar2 = FSerializer::Array<double>
                       (pFVar2,"displacement",&(port->mDisplacement).X,(double *)0x0,2,true);
    pFVar2 = Serialize(pFVar2,"planez",&port->mPlaneZ,(double *)0x0);
    Serialize(pFVar2,"skybox",(DObject **)&port->mSkybox,(DObject **)0x0,(bool *)0x0);
    FSerializer::EndObject(pFVar2);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FSectorPortal &port, FSectorPortal *def)
{
	if (arc.BeginObject(key))
	{
		arc("type", port.mType)
			("flags", port.mFlags)
			("partner", port.mPartner)
			("plane", port.mPlane)
			("origin", port.mOrigin)
			("destination", port.mDestination)
			("displacement", port.mDisplacement)
			("planez", port.mPlaneZ)
			("skybox", port.mSkybox)
			.EndObject();
	}
	return arc;
}